

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTOCTDec2(octet *val,octet *der,size_t count,u32 tag,size_t len)

{
  size_t sVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  size_t in_RSI;
  octet *in_RDI;
  void *in_R8;
  octet *v;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  octet **in_stack_fffffffffffffff8;
  
  sVar1 = derDec3(in_stack_fffffffffffffff8,in_RDI,in_RSI,(u32)((ulong)in_RDX >> 0x20),
                  CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = 0xffffffffffffffff;
  }
  else if (in_RDI != (octet *)0x0) {
    memMove(in_R8,in_stack_ffffffffffffffc8,0x1246ba);
  }
  return sVar1;
}

Assistant:

size_t derTOCTDec2(octet* val, const octet der[], size_t count, u32 tag,
	size_t len)
{
	const octet* v;
	count = derDec3(&v, der, count, tag, len);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	if (val)
		memMove(val, v, len);
	return count;
}